

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O1

ATNNode<wchar_t> * __thiscall
Centaurus::Grammar<wchar_t>::resolve(Grammar<wchar_t> *this,ATNPath *path)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_networks)._M_h,
                 &(path->
                  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ).
                  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].first);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    return (ATNNode<wchar_t> *)
           ((long)(path->
                  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ).
                  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].second * 0x98 +
           *(long *)((long)cVar1.
                           super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_true>
                           ._M_cur + 0x38));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

const ATNNode<TCHAR>& resolve(const ATNPath& path) const
    {
        return m_networks.at(path.leaf_id()).get_node(path.leaf_index());
    }